

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

int evfilt_signal_copyout(kevent *dst,int nevents,filter *filt,knote *src,void *x)

{
  uintptr_t uVar1;
  void *pvVar2;
  short sVar3;
  unsigned_short uVar4;
  uint uVar5;
  int iVar6;
  ssize_t sVar7;
  int *piVar8;
  ushort uVar9;
  undefined1 local_a0 [128];
  
  sVar7 = read((src->field_10).kn_timerfd,local_a0,0x80);
  if (sVar7 != 0x80) {
    piVar8 = __errno_location();
    if (*piVar8 != 0xb) {
      abort();
    }
  }
  uVar1 = (src->kev).ident;
  sVar3 = (src->kev).filter;
  uVar4 = (src->kev).flags;
  uVar5 = (src->kev).fflags;
  pvVar2 = (src->kev).udata;
  dst->data = (src->kev).data;
  dst->udata = pvVar2;
  dst->ident = uVar1;
  dst->filter = sVar3;
  dst->flags = uVar4;
  dst->fflags = uVar5;
  dst->data = 1;
  uVar9 = (src->kev).flags;
  iVar6 = 0;
  if ((char)uVar9 < '\0') {
    iVar6 = knote_disable(filt,src);
    uVar9 = (src->kev).flags;
  }
  if ((uVar9 & 0x10) != 0) {
    iVar6 = knote_delete(filt,src);
  }
  return iVar6 >> 0x1f | 1;
}

Assistant:

int
evfilt_signal_copyout(struct kevent *dst, UNUSED int nevents, struct filter *filt,
    struct knote *src, void *x UNUSED)
{
    int sigfd;

    sigfd = src->kn_signalfd;

    signalfd_reset(sigfd);

    memcpy(dst, &src->kev, sizeof(*dst));
    /* NOTE: dst->data should be the number of times the signal occurred,
       but that information is not available.
     */
    dst->data = 1;

    if (knote_copyout_flag_actions(filt, src) < 0) return -1;

    return (1);
}